

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

csubstr __thiscall c4::yml::Parser::_scan_block(Parser *this)

{
  Location LVar1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  ro_substr pattern;
  ro_substr pattern_00;
  ro_substr chars;
  ro_substr chars_00;
  ro_substr chars_01;
  csubstr buf;
  ulong uVar6;
  bool bVar7;
  error_flags eVar8;
  int iVar9;
  size_t sVar10;
  Parser *in_RDI;
  csubstr cVar11;
  char msg_5 [81];
  LineContents lc;
  size_t provisional_indentation;
  size_t first;
  size_t num_lines;
  char msg_4 [73];
  substr raw_block;
  size_t pos;
  char msg_3 [27];
  csubstr t;
  char msg_2 [40];
  csubstr digits;
  size_t indentation;
  BlockChomp_e chomp;
  BlockStyle_e newline;
  char msg_1 [57];
  char msg [37];
  csubstr trimmed;
  csubstr s;
  undefined4 in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff964;
  undefined4 in_stack_fffffffffffff968;
  undefined4 in_stack_fffffffffffff96c;
  flag_t in_stack_fffffffffffff970;
  undefined4 in_stack_fffffffffffff974;
  basic_substring<const_char> *in_stack_fffffffffffff978;
  undefined7 in_stack_fffffffffffff980;
  char in_stack_fffffffffffff987;
  basic_substring<const_char> *in_stack_fffffffffffff988;
  char *pcVar12;
  size_t in_stack_fffffffffffff990;
  pfn_error p_Var13;
  basic_substring<const_char> *in_stack_fffffffffffff998;
  char *in_stack_fffffffffffff9a0;
  ulong uVar14;
  basic_substring<const_char> *in_stack_fffffffffffff9a8;
  undefined7 in_stack_fffffffffffff9b0;
  char in_stack_fffffffffffff9b7;
  basic_substring<const_char> *in_stack_fffffffffffff9b8;
  undefined6 in_stack_fffffffffffff9c8;
  undefined1 in_stack_fffffffffffff9ce;
  byte bVar15;
  char *in_stack_fffffffffffff9d0;
  basic_substring<const_char> *in_stack_fffffffffffff9d8;
  Parser *in_stack_fffffffffffff9e0;
  undefined7 in_stack_fffffffffffffa10;
  undefined1 in_stack_fffffffffffffa17;
  char **in_stack_fffffffffffffa38;
  undefined7 in_stack_fffffffffffffa40;
  undefined1 in_stack_fffffffffffffa47;
  unsigned_long *in_stack_fffffffffffffa50;
  pfn_error in_stack_fffffffffffffa58;
  undefined7 in_stack_fffffffffffffa60;
  undefined1 in_stack_fffffffffffffa67;
  LineContents *in_stack_fffffffffffffaa8;
  char *in_stack_fffffffffffffab0;
  size_t in_stack_fffffffffffffab8;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  size_t local_510;
  char local_508 [88];
  basic_substring<char_const> local_4b0 [16];
  basic_substring<char_const> local_4a0 [16];
  basic_substring<char_const> local_490 [16];
  basic_substring<const_char> local_480;
  ro_substr local_470;
  undefined1 local_460 [24];
  ulong local_448;
  undefined1 auStack_440 [16];
  ulong local_430;
  ulong local_428;
  size_t local_420;
  long local_418;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined4 local_400;
  undefined4 uStack_3fc;
  flag_t fStack_3f8;
  undefined4 uStack_3f4;
  basic_substring<const_char> *local_3f0;
  char local_3e8 [8];
  Parser *in_stack_fffffffffffffc20;
  char *local_398;
  long lStack_390;
  basic_substring<char_const> local_388 [16];
  char *local_378;
  char *local_370;
  basic_substring<char_const> local_368 [16];
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  basic_substring<char_const> local_328 [16];
  char *local_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  basic_substring<const_char> *local_2f0;
  unsigned_long local_2e8;
  char local_2e0 [32];
  char *local_2c0;
  char *local_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  basic_substring<const_char> *local_290;
  char local_288 [40];
  ro_substr local_260;
  undefined1 local_250 [112];
  Parser *in_stack_fffffffffffffe20;
  csubstr in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe40;
  size_t in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe50;
  size_t sStack_1a8;
  basic_substring<const_char> *local_1a0;
  char *local_170;
  char *local_168;
  basic_substring<const_char> local_158;
  char **local_148;
  LineContents *local_140;
  basic_substring<const_char> *local_138;
  Parser *local_130;
  char *local_128;
  undefined4 local_120;
  char *local_118;
  char **local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  undefined4 local_f0;
  State local_e8;
  flag_t local_50;
  char *local_48;
  char **local_40;
  char *local_38;
  undefined4 local_30;
  char *local_28;
  char **local_20;
  char *local_18;
  char *local_10;
  substr *local_8;
  
  local_158.str = (in_RDI->m_state->line_contents).rem.str;
  local_158.len = (in_RDI->m_state->line_contents).rem.len;
  _local_170 = basic_substring<const_char>::triml
                         (in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b7);
  if (local_158.str < local_170) {
    if (local_170 < local_158.str) {
      memcpy(&stack0xfffffffffffffe68,"check failed: (trimmed.str >= s.str)",0x25);
      eVar8 = get_error_flags();
      if (((eVar8 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        trap_instruction();
      }
      p_Var13 = (in_RDI->m_stack).m_callbacks.m_error;
      Location::Location((Location *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980),
                         (char *)in_stack_fffffffffffff978,
                         CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                         CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                         CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
      in_stack_fffffffffffff968 = SUB84(in_stack_fffffffffffffe50,0);
      in_stack_fffffffffffff96c = (undefined4)((ulong)in_stack_fffffffffffffe50 >> 0x20);
      in_stack_fffffffffffff970 = (flag_t)sStack_1a8;
      in_stack_fffffffffffff974 = (undefined4)(sStack_1a8 >> 0x20);
      in_stack_fffffffffffff960 = (undefined4)in_stack_fffffffffffffe48;
      in_stack_fffffffffffff964 = (undefined4)(in_stack_fffffffffffffe48 >> 0x20);
      LVar1.super_LineCol.line._0_4_ = in_stack_fffffffffffff960;
      LVar1.super_LineCol.offset = (size_t)in_stack_fffffffffffffe40;
      LVar1.super_LineCol.line._4_4_ = in_stack_fffffffffffff964;
      LVar1.super_LineCol.col._0_4_ = in_stack_fffffffffffff968;
      LVar1.super_LineCol.col._4_4_ = in_stack_fffffffffffff96c;
      LVar1.name.str._0_4_ = in_stack_fffffffffffff970;
      LVar1.name.str._4_4_ = in_stack_fffffffffffff974;
      LVar1.name.len = (size_t)local_1a0;
      (*p_Var13)(&stack0xfffffffffffffe68,0x25,LVar1,(in_RDI->m_stack).m_callbacks.m_user_data);
      in_stack_fffffffffffff978 = local_1a0;
    }
    _line_progressed((Parser *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
                     (size_t)in_stack_fffffffffffffa38);
    local_158.str = local_170;
    local_158.len = (size_t)local_168;
  }
  bVar7 = basic_substring<const_char>::begins_with(&local_158,'|');
  if ((!bVar7) && (bVar7 = basic_substring<const_char>::begins_with(&local_158,'>'), !bVar7)) {
    memcpy(local_250 + 0x48,"check failed: (s.begins_with(\'|\') || s.begins_with(\'>\'))",0x39);
    eVar8 = get_error_flags();
    if (((eVar8 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      trap_instruction();
    }
    p_Var13 = (in_RDI->m_stack).m_callbacks.m_error;
    Location::Location((Location *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980),
                       (char *)in_stack_fffffffffffff978,
                       CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                       CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                       CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
    in_stack_fffffffffffff968 = (undefined4)local_250._48_8_;
    in_stack_fffffffffffff96c = SUB84(local_250._48_8_,4);
    in_stack_fffffffffffff970 = (flag_t)local_250._56_8_;
    in_stack_fffffffffffff974 = SUB84(local_250._56_8_,4);
    in_stack_fffffffffffff960 = (undefined4)local_250._40_8_;
    in_stack_fffffffffffff964 = SUB84(local_250._40_8_,4);
    LVar2.super_LineCol.line._0_4_ = in_stack_fffffffffffff960;
    LVar2.super_LineCol.offset = local_250._32_8_;
    LVar2.super_LineCol.line._4_4_ = in_stack_fffffffffffff964;
    LVar2.super_LineCol.col._0_4_ = in_stack_fffffffffffff968;
    LVar2.super_LineCol.col._4_4_ = in_stack_fffffffffffff96c;
    LVar2.name.str._0_4_ = in_stack_fffffffffffff970;
    LVar2.name.str._4_4_ = in_stack_fffffffffffff974;
    LVar2.name.len = local_250._64_8_;
    (*p_Var13)(local_250 + 0x48,0x39,LVar2,(in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffff978 = (basic_substring<const_char> *)local_250._64_8_;
  }
  bVar7 = basic_substring<const_char>::begins_with(&local_158,'>');
  local_250._28_4_ = ZEXT14(bVar7);
  local_250._24_4_ = 0;
  local_250._16_8_ = 0xffffffffffffffff;
  basic_substring<const_char>::basic_substring((basic_substring<const_char> *)local_250);
  if ((char *)0x1 < local_158.len) {
    basic_substring<char_const>::basic_substring<3ul>
              ((basic_substring<char_const> *)&local_260,(char (*) [3])"|>");
    bVar7 = basic_substring<const_char>::begins_with_any(&local_158,local_260);
    if (!bVar7) {
      memcpy(local_288,"check failed: (s.begins_with_any(\"|>\"))",0x28);
      eVar8 = get_error_flags();
      if (((eVar8 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        trap_instruction();
      }
      p_Var13 = (in_RDI->m_stack).m_callbacks.m_error;
      Location::Location((Location *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980),
                         (char *)in_stack_fffffffffffff978,
                         CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                         CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                         CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
      in_stack_fffffffffffff968 = (undefined4)local_2a0;
      in_stack_fffffffffffff96c = (undefined4)((ulong)local_2a0 >> 0x20);
      in_stack_fffffffffffff970 = (flag_t)uStack_298;
      in_stack_fffffffffffff974 = (undefined4)((ulong)uStack_298 >> 0x20);
      in_stack_fffffffffffff960 = (undefined4)uStack_2a8;
      in_stack_fffffffffffff964 = (undefined4)((ulong)uStack_2a8 >> 0x20);
      LVar3.super_LineCol.line._0_4_ = in_stack_fffffffffffff960;
      LVar3.super_LineCol.offset = local_2b0;
      LVar3.super_LineCol.line._4_4_ = in_stack_fffffffffffff964;
      LVar3.super_LineCol.col._0_4_ = in_stack_fffffffffffff968;
      LVar3.super_LineCol.col._4_4_ = in_stack_fffffffffffff96c;
      LVar3.name.str._0_4_ = in_stack_fffffffffffff970;
      LVar3.name.str._4_4_ = in_stack_fffffffffffff974;
      LVar3.name.len = (size_t)local_290;
      (*p_Var13)(local_288,0x28,LVar3,(in_RDI->m_stack).m_callbacks.m_user_data);
      in_stack_fffffffffffff978 = local_290;
    }
    local_e8.level = (size_t)&local_158;
    local_e8.flags = 1;
    local_e8._4_4_ = 0;
    if ((char *)local_158.len == (char *)0x0) {
      eVar8 = get_error_flags();
      if (((eVar8 & 1) != 0) &&
         (in_stack_fffffffffffffa67 = is_debugger_attached(), (bool)in_stack_fffffffffffffa67)) {
        trap_instruction();
      }
      local_f8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_f0 = 0x1533;
      handle_error(0x3fa1ef,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring
              ((basic_substring<const_char> *)
               CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980),
               (char *)in_stack_fffffffffffff978,
               CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
    local_2c0 = (char *)local_e8.node_id;
    local_2b8 = local_e8.scalar.str;
    if (local_e8.scalar.str == (char *)0x0) {
      local_2e8._0_1_ = 'c';
      local_2e8._1_1_ = 'h';
      local_2e8._2_1_ = 'e';
      local_2e8._3_1_ = 'c';
      local_2e8._4_1_ = 'k';
      local_2e8._5_1_ = ' ';
      local_2e8._6_1_ = 'f';
      local_2e8._7_1_ = 'a';
      builtin_strncpy(local_2e0,"iled: (t.len >= 1)",0x13);
      eVar8 = get_error_flags();
      if (((eVar8 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        trap_instruction();
      }
      in_stack_fffffffffffffa58 = (in_RDI->m_stack).m_callbacks.m_error;
      in_stack_fffffffffffffa50 = &local_2e8;
      Location::Location((Location *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980),
                         (char *)in_stack_fffffffffffff978,
                         CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                         CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                         CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
      in_stack_fffffffffffff968 = (undefined4)local_300;
      in_stack_fffffffffffff96c = (undefined4)((ulong)local_300 >> 0x20);
      in_stack_fffffffffffff970 = (flag_t)uStack_2f8;
      in_stack_fffffffffffff974 = (undefined4)((ulong)uStack_2f8 >> 0x20);
      in_stack_fffffffffffff960 = (undefined4)uStack_308;
      in_stack_fffffffffffff964 = (undefined4)((ulong)uStack_308 >> 0x20);
      LVar4.super_LineCol.line._0_4_ = in_stack_fffffffffffff960;
      LVar4.super_LineCol.offset = local_310;
      LVar4.super_LineCol.line._4_4_ = in_stack_fffffffffffff964;
      LVar4.super_LineCol.col._0_4_ = in_stack_fffffffffffff968;
      LVar4.super_LineCol.col._4_4_ = in_stack_fffffffffffff96c;
      LVar4.name.str._0_4_ = in_stack_fffffffffffff970;
      LVar4.name.str._4_4_ = in_stack_fffffffffffff974;
      LVar4.name.len = (size_t)local_2f0;
      (*in_stack_fffffffffffffa58)
                ((char *)in_stack_fffffffffffffa50,0x1b,LVar4,
                 (in_RDI->m_stack).m_callbacks.m_user_data);
      in_stack_fffffffffffff978 = local_2f0;
    }
    basic_substring<char_const>::basic_substring<3ul>(local_328,(char (*) [3])"-+");
    chars_01.str._7_1_ = in_stack_fffffffffffff9b7;
    chars_01.str._0_7_ = in_stack_fffffffffffff9b0;
    chars_01.len = (size_t)in_stack_fffffffffffff9b8;
    local_318 = (char *)basic_substring<const_char>::first_of
                                  (in_stack_fffffffffffff9a8,chars_01,
                                   (size_t)in_stack_fffffffffffff9a0);
    if (local_318 != (char *)0xffffffffffffffff) {
      local_40 = &local_2c0;
      local_48 = local_318;
      if (local_2b8 <= local_318) {
        eVar8 = get_error_flags();
        if (((eVar8 & 1) != 0) &&
           (in_stack_fffffffffffffa47 = is_debugger_attached(), (bool)in_stack_fffffffffffffa47)) {
          trap_instruction();
        }
        local_e8.indref = 0x3fa1ef;
        local_50 = 0x14c3;
        handle_error(0x3fa1ef,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
      }
      if (local_2c0[(long)local_48] == '-') {
        local_250._24_4_ = 1;
      }
      else {
        in_stack_fffffffffffffa38 = &local_2c0;
        local_e8.line_contents.rem.len = (size_t)local_318;
        local_e8.line_contents.indentation = (size_t)in_stack_fffffffffffffa38;
        if (local_2b8 <= local_318) {
          eVar8 = get_error_flags();
          if (((eVar8 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            trap_instruction();
          }
          local_e8.line_contents.stripped.len = 0x3fa1ef;
          local_e8.line_contents.rem.str._0_4_ = 0x14c3;
          handle_error(0x3fa1ef,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
        }
        if (*(char *)(local_e8.line_contents.rem.len + (long)*in_stack_fffffffffffffa38) == '+') {
          local_250._24_4_ = 2;
        }
      }
      if (local_318 == (char *)0x0) {
        local_110 = &local_2c0;
        local_118 = (char *)0x1;
        if (local_2b8 == (char *)0x0) {
          eVar8 = get_error_flags();
          if (((eVar8 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            trap_instruction();
          }
          local_128 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_120 = 0x1533;
          handle_error(0x3fa1ef,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
        }
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)
                   CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980),
                   (char *)in_stack_fffffffffffff978,
                   CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
        local_338 = local_108;
        local_330 = local_100;
        local_2c0 = local_108;
        local_2b8 = local_100;
      }
      else {
        local_e8.line_contents.full.str = (char *)&local_2c0;
        local_e8.pos.name.len = (size_t)local_318;
        if (local_2b8 < local_318 && local_318 != (char *)0xffffffffffffffff) {
          eVar8 = get_error_flags();
          if (((eVar8 & 1) != 0) &&
             (in_stack_fffffffffffffa17 = is_debugger_attached(), (bool)in_stack_fffffffffffffa17))
          {
            trap_instruction();
          }
          local_e8.pos.super_LineCol.col = 0x3fa1ef;
          local_e8.pos.name.str._0_4_ = 0x154e;
          handle_error(0x3fa1ef,(char *)0x154e,"check failed: %s","num <= len || num == npos");
        }
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)
                   CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980),
                   (char *)in_stack_fffffffffffff978,
                   CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
        local_348 = (char *)local_e8.line_contents.full.len;
        local_340 = local_e8.line_contents.stripped.str;
        local_2c0 = (char *)local_e8.line_contents.full.len;
        local_2b8 = local_e8.line_contents.stripped.str;
      }
    }
    basic_substring<char_const>::basic_substring<11ul>(local_368,(char (*) [11])"0123456789");
    chars_00.len = (size_t)in_stack_fffffffffffff9a8;
    chars_00.str = in_stack_fffffffffffff9a0;
    local_28 = (char *)basic_substring<const_char>::first_not_of
                                 (in_stack_fffffffffffff998,chars_00,in_stack_fffffffffffff990);
    local_20 = &local_2c0;
    if (local_2b8 < local_28 && local_28 != (char *)0xffffffffffffffff) {
      eVar8 = get_error_flags();
      if (((eVar8 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        trap_instruction();
      }
      local_38 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_30 = 0x1569;
      handle_error(0x3fa1ef,(char *)0x1569,"check failed: %s","pos <= len || pos == npos");
    }
    if (local_28 == (char *)0xffffffffffffffff) {
      local_18 = local_2c0;
      local_10 = local_2b8;
    }
    else {
      basic_substring<const_char>::basic_substring
                ((basic_substring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980),
                 (char *)in_stack_fffffffffffff978,
                 CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
    }
    local_358 = local_18;
    local_350 = local_10;
    local_250._0_8_ = local_18;
    local_250._8_8_ = local_10;
    in_stack_fffffffffffff9e0 = (Parser *)local_250;
    local_130 = in_stack_fffffffffffff9e0;
    if (local_10 != (char *)0x0 && local_18 != (char *)0x0) {
      local_378 = local_18;
      local_370 = local_10;
      cVar11.len._0_7_ = in_stack_fffffffffffffa60;
      cVar11.str = (char *)in_stack_fffffffffffffa58;
      cVar11.len._7_1_ = in_stack_fffffffffffffa67;
      bVar7 = atou<unsigned_long>(cVar11,in_stack_fffffffffffffa50);
      if (!bVar7) {
        bVar7 = is_debugger_attached();
        if ((bVar7) && (bVar7 = is_debugger_attached(), bVar7)) {
          trap_instruction();
        }
        basic_substring<char_const>::basic_substring<43ul>
                  (local_388,(char (*) [43])"ERROR: parse error: could not read decimal");
        _err<>(in_stack_fffffffffffffe20,in_stack_fffffffffffffe28);
      }
      local_250._16_8_ = in_RDI->m_state->indref + local_250._16_8_;
    }
  }
  _line_progressed((Parser *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
                   (size_t)in_stack_fffffffffffffa38);
  _line_ended((Parser *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
  _scan_line(in_stack_fffffffffffff9e0);
  local_8 = &in_RDI->m_buf;
  basic_substring<char>::basic_substring
            ((basic_substring<char> *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980),
             (char *)in_stack_fffffffffffff978,
             CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970));
  local_148 = &local_398;
  local_140 = &in_RDI->m_state->line_contents;
  if (local_398 != (local_140->full).str) {
    memcpy(local_3e8,"check failed: (raw_block.begin() == m_state->line_contents.full.begin())",0x49
          );
    eVar8 = get_error_flags();
    if (((eVar8 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      trap_instruction();
    }
    in_stack_fffffffffffff9d8 = (basic_substring<const_char> *)(in_RDI->m_stack).m_callbacks.m_error
    ;
    in_stack_fffffffffffff9d0 = local_3e8;
    Location::Location((Location *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980),
                       (char *)in_stack_fffffffffffff978,
                       CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                       CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                       CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
    (*(code *)in_stack_fffffffffffff9d8)
              (in_stack_fffffffffffff9d0,0x49,(in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffff960 = uStack_408;
    in_stack_fffffffffffff964 = uStack_404;
    in_stack_fffffffffffff968 = local_400;
    in_stack_fffffffffffff96c = uStack_3fc;
    in_stack_fffffffffffff970 = fStack_3f8;
    in_stack_fffffffffffff974 = uStack_3f4;
    in_stack_fffffffffffff978 = local_3f0;
  }
  local_418 = 0;
  local_420 = (in_RDI->m_state->pos).super_LineCol.line;
  local_428 = 0xffffffffffffffff;
  LineContents::LineContents
            ((LineContents *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
  do {
    bVar7 = _finished_file(in_RDI);
    if (((bVar7 ^ 0xffU) & 1) == 0) {
LAB_003c0f22:
      if (((in_RDI->m_state->pos).super_LineCol.line != local_420 + local_418) && (lStack_390 != 0))
      {
        memcpy(local_508,
               "check failed: (m_state->pos.line == (first + num_lines) || (raw_block.len == 0))",
               0x51);
        eVar8 = get_error_flags();
        if (((eVar8 & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
          trap_instruction();
        }
        p_Var13 = (in_RDI->m_stack).m_callbacks.m_error;
        pcVar12 = local_508;
        Location::Location((Location *)CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980)
                           ,(char *)in_stack_fffffffffffff978,
                           CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
                           CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                           CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
        LVar5.super_LineCol.line._0_4_ = (int)uStack_528;
        LVar5.super_LineCol.offset = local_530;
        LVar5.super_LineCol.line._4_4_ = (int)((ulong)uStack_528 >> 0x20);
        LVar5.super_LineCol.col._0_4_ = (int)local_520;
        LVar5.super_LineCol.col._4_4_ = (int)((ulong)local_520 >> 0x20);
        LVar5.name.str._0_4_ = (int)uStack_518;
        LVar5.name.str._4_4_ = (int)((ulong)uStack_518 >> 0x20);
        LVar5.name.len = local_510;
        (*p_Var13)(pcVar12,0x51,LVar5,(in_RDI->m_stack).m_callbacks.m_user_data);
      }
      if (local_250._16_8_ == 0xffffffffffffffff) {
        local_250._16_8_ = local_428;
      }
      if (local_418 != 0) {
        _line_ended_undo(in_stack_fffffffffffffc20);
      }
      cVar11 = _filter_block_scalar
                         ((Parser *)msg_4._32_8_,(substr)msg_4._40_16_,msg_4._28_4_,msg_4._24_4_,
                          msg_4._16_8_);
      return cVar11;
    }
    local_470 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x3c0aa4)
    ;
    buf.len = in_stack_fffffffffffffab8;
    buf.str = in_stack_fffffffffffffab0;
    LineContents::reset_with_next_line(in_stack_fffffffffffffaa8,buf,(size_t)in_RDI);
    if (local_250._16_8_ == 0xffffffffffffffff) {
      sVar10 = basic_substring<const_char>::first_not_of
                         (in_stack_fffffffffffff988,in_stack_fffffffffffff987,
                          (size_t)in_stack_fffffffffffff978);
      if (sVar10 == 0xffffffffffffffff) {
        if (local_428 == 0xffffffffffffffff) {
          uVar14 = local_430;
          if (local_430 == 0) {
            bVar7 = has_any(in_RDI,0x88);
            uVar14 = (ulong)bVar7;
          }
          local_428 = uVar14;
          uVar6 = local_250._16_8_;
          if ((uVar14 == 0xffffffffffffffff) && (local_428 = local_448, local_448 == 0)) {
            local_428 = uVar14;
            bVar7 = has_any(in_RDI,0x88);
            local_428 = (ulong)bVar7;
            uVar6 = local_250._16_8_;
          }
        }
        else {
          uVar6 = local_250._16_8_;
          if (local_428 <= local_448) {
            local_428 = local_448;
          }
        }
      }
      else if (local_428 == 0xffffffffffffffff) {
        if (local_430 < in_RDI->m_state->indref) {
          if (lStack_390 == 0) {
            _line_ended_undo(in_stack_fffffffffffffc20);
          }
          goto LAB_003c0f22;
        }
        uVar6 = local_430;
        if ((local_430 == in_RDI->m_state->indref) &&
           (bVar7 = has_any(in_RDI,0xc), uVar6 = local_430, bVar7)) goto LAB_003c0f22;
      }
      else {
        uVar6 = local_430;
        if (local_430 < local_428) goto LAB_003c0f22;
      }
    }
    else {
      bVar15 = 0;
      if (local_430 < (ulong)local_250._16_8_) {
        basic_substring<char_const>::basic_substring<5ul>(local_490,(char (*) [5])" \t\r\n");
        chars.len = in_stack_fffffffffffff990;
        chars.str = (char *)in_stack_fffffffffffff988;
        local_480 = basic_substring<const_char>::trim
                              ((basic_substring<const_char> *)
                               CONCAT17(in_stack_fffffffffffff987,in_stack_fffffffffffff980),chars);
        local_138 = &local_480;
        in_stack_fffffffffffff9ce = true;
        if (local_480.len != 0) {
          in_stack_fffffffffffff9ce = local_480.str == (char *)0x0;
        }
        bVar15 = in_stack_fffffffffffff9ce ^ 0xff;
      }
      if ((bVar15 & 1) != 0) goto LAB_003c0f22;
      uVar6 = local_250._16_8_;
      if (local_250._16_8_ == 0) {
        local_e8.pos.super_LineCol.line = (size_t)auStack_440;
        local_e8.pos.super_LineCol.offset = 0x3f3a31;
        iVar9 = basic_substring<const_char>::compare
                          (in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
                           CONCAT17(bVar15,CONCAT16(in_stack_fffffffffffff9ce,
                                                    in_stack_fffffffffffff9c8)));
        if (iVar9 == 0) goto LAB_003c0f22;
        basic_substring<char_const>::basic_substring<5ul>(local_4a0,(char (*) [5])0x3f26a0);
        pattern.str._7_1_ = in_stack_fffffffffffff987;
        pattern.str._0_7_ = in_stack_fffffffffffff980;
        pattern.len = (size_t)in_stack_fffffffffffff988;
        bVar7 = basic_substring<const_char>::begins_with(in_stack_fffffffffffff978,pattern);
        if (bVar7) goto LAB_003c0f22;
        local_e8.scalar_col = (size_t)auStack_440;
        local_e8.scalar.len = 0x3fa601;
        iVar9 = basic_substring<const_char>::compare
                          (in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
                           CONCAT17(bVar15,CONCAT16(in_stack_fffffffffffff9ce,
                                                    in_stack_fffffffffffff9c8)));
        if (iVar9 == 0) goto LAB_003c0f22;
        basic_substring<char_const>::basic_substring<5ul>(local_4b0,(char (*) [5])"--- ");
        pattern_00.str._7_1_ = in_stack_fffffffffffff987;
        pattern_00.str._0_7_ = in_stack_fffffffffffff980;
        pattern_00.len = (size_t)in_stack_fffffffffffff988;
        bVar7 = basic_substring<const_char>::begins_with(in_stack_fffffffffffff978,pattern_00);
        uVar6 = local_250._16_8_;
        if (bVar7) goto LAB_003c0f22;
      }
    }
    local_250._16_8_ = uVar6;
    memcpy(&in_RDI->m_state->line_contents,local_460,0x38);
    lStack_390 = (in_RDI->m_state->line_contents).full.len + lStack_390;
    _line_progressed((Parser *)CONCAT17(in_stack_fffffffffffffa47,in_stack_fffffffffffffa40),
                     (size_t)in_stack_fffffffffffffa38);
    _line_ended((Parser *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
    local_418 = local_418 + 1;
  } while( true );
}

Assistant:

csubstr Parser::_scan_block()
{
    // nice explanation here: http://yaml-multiline.info/
    csubstr s = m_state->line_contents.rem;
    csubstr trimmed = s.triml(' ');
    if(trimmed.str > s.str)
    {
        _c4dbgp("skipping whitespace");
        _RYML_CB_ASSERT(m_stack.m_callbacks, trimmed.str >= s.str);
        _line_progressed(static_cast<size_t>(trimmed.str - s.str));
        s = trimmed;
    }
    _RYML_CB_ASSERT(m_stack.m_callbacks, s.begins_with('|') || s.begins_with('>'));

    _c4dbgpf("scanning block: specs=\"{}\"", s);

    // parse the spec
    BlockStyle_e newline = s.begins_with('>') ? BLOCK_FOLD : BLOCK_LITERAL;
    BlockChomp_e chomp = CHOMP_CLIP; // default to clip unless + or - are used
    size_t indentation = npos; // have to find out if no spec is given
    csubstr digits;
    if(s.len > 1)
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, s.begins_with_any("|>"));
        csubstr t = s.sub(1);
        _c4dbgpf("scanning block: spec is multichar: '{}'", t);
        _RYML_CB_ASSERT(m_stack.m_callbacks, t.len >= 1);
        size_t pos = t.first_of("-+");
        _c4dbgpf("scanning block: spec chomp char at {}", pos);
        if(pos != npos)
        {
            if(t[pos] == '-')
                chomp = CHOMP_STRIP;
            else if(t[pos] == '+')
                chomp = CHOMP_KEEP;
            if(pos == 0)
                t = t.sub(1);
            else
                t = t.first(pos);
        }
        // from here to the end, only digits are considered
        digits = t.left_of(t.first_not_of("0123456789"));
        if( ! digits.empty())
        {
            if( ! c4::atou(digits, &indentation))
                _c4err("parse error: could not read decimal");
            _c4dbgpf("scanning block: indentation specified: {}. add {} from curr state -> {}", indentation, m_state->indref, indentation+m_state->indref);
            indentation += m_state->indref;
        }
    }

    // finish the current line
    _line_progressed(s.len);
    _line_ended();
    _scan_line();

    _c4dbgpf("scanning block: style={}  chomp={}  indentation={}", newline==BLOCK_FOLD ? "fold" : "literal", chomp==CHOMP_CLIP ? "clip" : (chomp==CHOMP_STRIP ? "strip" : "keep"), indentation);

    // start with a zero-length block, already pointing at the right place
    substr raw_block(m_buf.data() + m_state->pos.offset, size_t(0));// m_state->line_contents.full.sub(0, 0);
    _RYML_CB_ASSERT(m_stack.m_callbacks, raw_block.begin() == m_state->line_contents.full.begin());

    // read every full line into a raw block,
    // from which newlines are to be stripped as needed.
    //
    // If no explicit indentation was given, pick it from the first
    // non-empty line. See
    // https://yaml.org/spec/1.2.2/#8111-block-indentation-indicator
    size_t num_lines = 0, first = m_state->pos.line, provisional_indentation = npos;
    LineContents lc;
    while(( ! _finished_file()))
    {
        // peek next line, but do not advance immediately
        lc.reset_with_next_line(m_buf, m_state->pos.offset);
        _c4dbgpf("scanning block: peeking at '{}'", lc.stripped);
        // evaluate termination conditions
        if(indentation != npos)
        {
            // stop when the line is deindented and not empty
            if(lc.indentation < indentation && ( ! lc.rem.trim(" \t\r\n").empty()))
            {
                _c4dbgpf("scanning block: indentation decreased ref={} thisline={}", indentation, lc.indentation);
                break;
            }
            else if(indentation == 0)
            {
                if((lc.rem == "..." || lc.rem.begins_with("... "))
                    ||
                   (lc.rem == "---" || lc.rem.begins_with("--- ")))
                {
                    _c4dbgp("scanning block: stop. indentation=0 and stream ended");
                    break;
                }
            }
        }
        else
        {
            _c4dbgpf("scanning block: indentation ref not set. firstnonws={}", lc.stripped.first_not_of(' '));
            if(lc.stripped.first_not_of(' ') != npos) // non-empty line
            {
                _c4dbgpf("scanning block: line not empty. indref={} indprov={} indentation={}", m_state->indref, provisional_indentation, lc.indentation);
                if(provisional_indentation == npos)
                {
                    if(lc.indentation < m_state->indref)
                    {
                        _c4dbgpf("scanning block: block terminated indentation={} < indref={}", lc.indentation, m_state->indref);
                        if(raw_block.len == 0)
                        {
                            _c4dbgp("scanning block: was empty, undo next line");
                            _line_ended_undo();
                        }
                        break;
                    }
                    else if(lc.indentation == m_state->indref)
                    {
                        if(has_any(RSEQ|RMAP))
                        {
                            _c4dbgpf("scanning block: block terminated. reading container and indentation={}==indref={}", lc.indentation, m_state->indref);
                            break;
                        }
                    }
                    _c4dbgpf("scanning block: set indentation ref from this line: ref={}", lc.indentation);
                    indentation = lc.indentation;
                }
                else
                {
                    if(lc.indentation >= provisional_indentation)
                    {
                        _c4dbgpf("scanning block: set indentation ref from provisional indentation: provisional_ref={}, thisline={}", provisional_indentation, lc.indentation);
                        //indentation = provisional_indentation ? provisional_indentation : lc.indentation;
                        indentation = lc.indentation;
                    }
                    else
                    {
                        break;
                        //_c4err("parse error: first non-empty block line should have at least the original indentation");
                    }
                }
            }
            else // empty line
            {
                _c4dbgpf("scanning block: line empty or {} spaces. line_indentation={} prov_indentation={}", lc.stripped.len, lc.indentation, provisional_indentation);
                if(provisional_indentation != npos)
                {
                    if(lc.stripped.len >= provisional_indentation)
                    {
                        _c4dbgpf("scanning block: increase provisional_ref {} -> {}", provisional_indentation, lc.stripped.len);
                        provisional_indentation = lc.stripped.len;
                    }
                    #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
                    else if(lc.indentation >= provisional_indentation && lc.indentation != npos)
                    {
                        _c4dbgpf("scanning block: increase provisional_ref {} -> {}", provisional_indentation, lc.indentation);
                        provisional_indentation = lc.indentation;
                    }
                    #endif
                }
                else
                {
                    provisional_indentation = lc.indentation ? lc.indentation : has_any(RSEQ|RVAL);
                    _c4dbgpf("scanning block: initialize provisional_ref={}", provisional_indentation);
                    if(provisional_indentation == npos)
                    {
                        provisional_indentation = lc.stripped.len ? lc.stripped.len : has_any(RSEQ|RVAL);
                        _c4dbgpf("scanning block: initialize provisional_ref={}", provisional_indentation);
                    }
                }
            }
        }
        // advance now that we know the folded scalar continues
        m_state->line_contents = lc;
        _c4dbgpf("scanning block: append '{}'", m_state->line_contents.rem);
        raw_block.len += m_state->line_contents.full.len;
        _line_progressed(m_state->line_contents.rem.len);
        _line_ended();
        ++num_lines;
    }
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.line == (first + num_lines) || (raw_block.len == 0));
    C4_UNUSED(num_lines);
    C4_UNUSED(first);

    if(indentation == npos)
    {
        _c4dbgpf("scanning block: set indentation from provisional: {}", provisional_indentation);
        indentation = provisional_indentation;
    }

    if(num_lines)
        _line_ended_undo();

    _c4dbgpf("scanning block: raw=~~~{}~~~", raw_block);

    // ok! now we strip the newlines and spaces according to the specs
    s = _filter_block_scalar(raw_block, newline, chomp, indentation);

    _c4dbgpf("scanning block: final=~~~{}~~~", s);

    return s;
}